

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

Float __thiscall pbrt::PortalImageInfiniteLight::Area(PortalImageInfiniteLight *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  Vector3<float> VVar11;
  
  auVar9 = in_ZMM1._4_60_;
  auVar5 = in_ZMM0._8_56_;
  VVar11 = Point3<float>::operator-((this->portal).values + 1,(this->portal).values);
  auVar7._0_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._4_60_ = auVar9;
  auVar3._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  auVar6 = auVar7._0_16_;
  VVar11 = Point3<float>::operator-((this->portal).values + 3,(this->portal).values);
  auVar8._4_60_ = auVar7._4_60_;
  auVar8._0_4_ = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  auVar1 = vinsertps_avx(auVar4._0_16_,auVar3._0_16_,0x4c);
  auVar2 = vinsertps_avx(auVar3._0_16_,auVar4._0_16_,0x1c);
  auVar10._0_4_ = auVar1._0_4_ * auVar1._0_4_;
  auVar10._4_4_ = auVar1._4_4_ * auVar1._4_4_;
  auVar10._8_4_ = auVar1._8_4_ * auVar1._8_4_;
  auVar10._12_4_ = auVar1._12_4_ * auVar1._12_4_;
  auVar2 = vfmadd213ps_fma(auVar2,auVar2,auVar10);
  auVar1 = vinsertps_avx(auVar6,auVar8._0_16_,0x10);
  auVar1 = vfmadd213ps_fma(auVar1,auVar1,auVar2);
  auVar2 = vsqrtps_avx(auVar1);
  auVar1 = vmovshdup_avx(auVar2);
  return auVar2._0_4_ * auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Area() const {
        return Length(portal[1] - portal[0]) * Length(portal[3] - portal[0]);
    }